

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int gmfsetreferencestringf77_(int64_t *MshIdx,int *kwd,int *idx,char *str,int siz)

{
  char *__dest;
  char *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  int64_t *in_RDI;
  int in_R8D;
  char *tmp;
  int ret;
  int local_4;
  
  __dest = (char *)malloc((long)(in_R8D + 1));
  if (__dest == (char *)0x0) {
    local_4 = 0;
  }
  else {
    strncpy(__dest,in_RCX,(long)in_R8D);
    __dest[in_R8D] = '\0';
    local_4 = GmfSetLin(*in_RDI,199,(ulong)*in_RSI,(ulong)*in_RDX,__dest);
    free(__dest);
  }
  return local_4;
}

Assistant:

int APIF77(gmfsetreferencestringf77)(int64_t *MshIdx, int *kwd, int *idx, char *str, int siz)
{
   int   ret;
   char *tmp = malloc(siz+1);

   // Allocate a string with one extra character to store the trailing 0
   if(!tmp)
      return(0);

   // Copy the Fortran string into the C string and add a trailing 0
   strncpy(tmp, str, siz);
   tmp[ siz ] = 0;

   // Now call the C procedure a free the temporary string
   ret = GmfSetLin(*MshIdx, GmfReferenceStrings, *kwd, *idx, tmp);
   free(tmp);

   return(ret);
}